

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

bool __thiscall wabt::WastLexer::ReadNum(WastLexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  long lVar3;
  
  pbVar2 = (byte *)this->cursor_;
joined_r0x00158101:
  do {
    if ((this->buffer_end_ <= pbVar2) || ((""[(ulong)*pbVar2 + 1] & 8U) == 0)) {
      return false;
    }
    pbVar1 = pbVar2 + 1;
    this->cursor_ = (char *)pbVar1;
    if (pbVar1 < this->buffer_end_) {
      if (*pbVar1 == 0x5f) {
        this->cursor_ = (char *)(pbVar2 + 2);
        pbVar2 = pbVar2 + 2;
        goto joined_r0x00158101;
      }
      lVar3 = (ulong)*pbVar1 + 1;
    }
    else {
      lVar3 = 0;
    }
    pbVar2 = pbVar1;
    if ((""[lVar3] & 8U) == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool WastLexer::ReadNum() {
  if (IsDigit(PeekChar())) {
    ReadChar();
    return MatchChar('_') || IsDigit(PeekChar()) ? ReadNum() : true;
  }
  return false;
}